

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroupCollection::CommitDropColumn(RowGroupCollection *this,idx_t column_index)

{
  SegmentIterator __begin1;
  SegmentIterator local_28;
  SegmentIterationHelper local_18;
  
  local_18.tree =
       &shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups)->
        super_SegmentTree<duckdb::RowGroup,_true>;
  local_28 = SegmentTree<duckdb::RowGroup,_true>::SegmentIterationHelper::begin(&local_18);
  while (local_28.current != (RowGroup *)0x0) {
    RowGroup::CommitDropColumn(local_28.current,column_index);
    SegmentTree<duckdb::RowGroup,_true>::SegmentIterationHelper::SegmentIterator::Next(&local_28);
  }
  return;
}

Assistant:

void RowGroupCollection::CommitDropColumn(const idx_t column_index) {
	for (auto &row_group : row_groups->Segments()) {
		row_group.CommitDropColumn(column_index);
	}
}